

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QMainWindowLayout::updateTabBarShapes(QMainWindowLayout *this)

{
  Shape shape_00;
  long in_RDI;
  long in_FS_OFFSET;
  Shape shape;
  TabPosition pos;
  int i;
  QDockAreaLayout *layout;
  TabPosition vertical [4];
  TabPosition local_44;
  int iVar1;
  TabPosition local_18 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18[0] = West;
  local_18[1] = East;
  local_18[2] = North;
  local_18[3] = South;
  for (iVar1 = 0; iVar1 < 4; iVar1 = iVar1 + 1) {
    if ((*(byte *)(in_RDI + 0x738) & 1) == 0) {
      local_44 = *(TabPosition *)(in_RDI + 0x764 + (long)iVar1 * 4);
    }
    else {
      local_44 = local_18[iVar1];
    }
    shape_00 = _q_tb_tabBarShapeFrom(*(TabShape *)(in_RDI + 0x774),local_44);
    QDockAreaLayoutInfo::setTabBarShape((QDockAreaLayoutInfo *)CONCAT44(iVar1,local_44),shape_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindowLayout::updateTabBarShapes()
{
#if QT_CONFIG(tabwidget)
    const QTabWidget::TabPosition vertical[] = {
        QTabWidget::West,
        QTabWidget::East,
        QTabWidget::North,
        QTabWidget::South
    };
#else
    const QTabBar::Shape vertical[] = {
        QTabBar::RoundedWest,
        QTabBar::RoundedEast,
        QTabBar::RoundedNorth,
        QTabBar::RoundedSouth
    };
#endif

    QDockAreaLayout &layout = layoutState.dockAreaLayout;

    for (int i = 0; i < QInternal::DockCount; ++i) {
#if QT_CONFIG(tabwidget)
        QTabWidget::TabPosition pos = verticalTabsEnabled ? vertical[i] : tabPositions[i];
        QTabBar::Shape shape = _q_tb_tabBarShapeFrom(_tabShape, pos);
#else
        QTabBar::Shape shape = verticalTabsEnabled ? vertical[i] : QTabBar::RoundedSouth;
#endif
        layout.docks[i].setTabBarShape(shape);
    }
}